

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynAccessor * ParseAccessorDefinition(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  SynBase *type_00;
  SynIdentifier *this;
  Lexeme *pLVar2;
  Lexeme *pLVar3;
  InplaceStr IVar4;
  InplaceStr setName;
  SynIdentifier *setNameIdentifier;
  SynBase *setBlock;
  SynBase *getBlock;
  SynIdentifier *nameIdentifier;
  InplaceStr name;
  SynBase *type;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  type_00 = ParseType(ctx,(bool *)0x0,false);
  if (type_00 == (SynBase *)0x0) {
    ctx_local = (ParseContext *)0x0;
  }
  else {
    bVar1 = anon_unknown.dwarf_104b6::CheckAt
                      (ctx,lex_string,"ERROR: class member name expected after type");
    if (bVar1) {
      IVar4 = ParseContext::Consume(ctx);
      this = ParseContext::get<SynIdentifier>(ctx);
      pLVar2 = ParseContext::Previous(ctx);
      pLVar3 = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier(this,pLVar2,pLVar3,IVar4);
      bVar1 = ParseContext::Consume(ctx,lex_ofigure);
      if (bVar1) {
        anon_unknown.dwarf_104b6::CheckConsume(ctx,"get","ERROR: \'get\' is expected after \'{\'");
        setBlock = &ParseBlock(ctx)->super_SynBase;
        if ((SynBlock *)setBlock == (SynBlock *)0x0) {
          pLVar2 = ParseContext::Current(ctx);
          anon_unknown.dwarf_104b6::Report(ctx,pLVar2,"ERROR: function body expected after \'get\'")
          ;
          setBlock = &ParseContext::get<SynError>(ctx)->super_SynBase;
          pLVar2 = ParseContext::Current(ctx);
          pLVar3 = ParseContext::Current(ctx);
          SynError::SynError((SynError *)setBlock,pLVar2,pLVar3);
        }
        setNameIdentifier = (SynIdentifier *)0x0;
        setName.end = (char *)0x0;
        bVar1 = ParseContext::Consume(ctx,"set");
        if (bVar1) {
          bVar1 = ParseContext::Consume(ctx,lex_oparen);
          if (bVar1) {
            bVar1 = anon_unknown.dwarf_104b6::CheckAt
                              (ctx,lex_string,"ERROR: r-value name not found after \'(\'");
            if (bVar1) {
              IVar4 = ParseContext::Consume(ctx);
              setName.end = (char *)ParseContext::get<SynIdentifier>(ctx);
              pLVar2 = ParseContext::Previous(ctx);
              pLVar3 = ParseContext::Previous(ctx);
              SynIdentifier::SynIdentifier((SynIdentifier *)setName.end,pLVar2,pLVar3,IVar4);
            }
            anon_unknown.dwarf_104b6::CheckConsume
                      (ctx,lex_cparen,"ERROR: \')\' not found after r-value");
          }
          setNameIdentifier = (SynIdentifier *)ParseBlock(ctx);
          if ((SynBlock *)setNameIdentifier == (SynBlock *)0x0) {
            pLVar2 = ParseContext::Current(ctx);
            anon_unknown.dwarf_104b6::Report
                      (ctx,pLVar2,"ERROR: function body expected after \'set\'");
            setNameIdentifier = (SynIdentifier *)ParseContext::get<SynError>(ctx);
            pLVar2 = ParseContext::Current(ctx);
            pLVar3 = ParseContext::Current(ctx);
            SynError::SynError((SynError *)setNameIdentifier,pLVar2,pLVar3);
          }
        }
        anon_unknown.dwarf_104b6::CheckConsume
                  (ctx,lex_cfigure,"ERROR: \'}\' is expected after property");
        anon_unknown.dwarf_104b6::CheckConsume
                  (ctx,lex_semicolon,"ERROR: \';\' not found after class member list");
        ctx_local = (ParseContext *)ParseContext::get<SynAccessor>(ctx);
        pLVar2 = ParseContext::Previous(ctx);
        SynAccessor::SynAccessor
                  ((SynAccessor *)ctx_local,begin,pLVar2,type_00,this,setBlock,
                   &setNameIdentifier->super_SynBase,(SynIdentifier *)setName.end);
      }
      else {
        ctx->currentLexeme = begin;
        ctx_local = (ParseContext *)0x0;
      }
    }
    else {
      ctx->currentLexeme = begin;
      ctx_local = (ParseContext *)0x0;
    }
  }
  return (SynAccessor *)ctx_local;
}

Assistant:

SynAccessor* ParseAccessorDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(SynBase *type = ParseType(ctx))
	{
		if(!CheckAt(ctx, lex_string, "ERROR: class member name expected after type"))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		if(!ctx.Consume(lex_ofigure))
		{
			// Backtrack
			ctx.currentLexeme = start;

			return NULL;
		}

		CheckConsume(ctx, "get", "ERROR: 'get' is expected after '{'");

		SynBase *getBlock = ParseBlock(ctx);

		if(!getBlock)
		{
			Report(ctx, ctx.Current(), "ERROR: function body expected after 'get'");

			getBlock = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		SynBase *setBlock = NULL;
		SynIdentifier *setNameIdentifier = NULL;

		if(ctx.Consume("set"))
		{
			if(ctx.Consume(lex_oparen))
			{
				if(CheckAt(ctx, lex_string, "ERROR: r-value name not found after '('"))
				{
					InplaceStr setName = ctx.Consume();
					setNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), setName);
				}

				CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after r-value");
			}

			setBlock = ParseBlock(ctx);

			if(!setBlock)
			{
				Report(ctx, ctx.Current(), "ERROR: function body expected after 'set'");

				setBlock = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}
		}

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' is expected after property");

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after class member list");

		return new (ctx.get<SynAccessor>()) SynAccessor(start, ctx.Previous(), type, nameIdentifier, getBlock, setBlock, setNameIdentifier);
	}

	return NULL;
}